

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForEnum
          (Generator *this,EnumDescriptor *enum_descriptor)

{
  bool bVar1;
  int iVar2;
  EnumOptions *this_00;
  EnumValueOptions *this_01;
  undefined8 uVar3;
  undefined8 uVar4;
  string local_148;
  string local_128;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  string value_options;
  EnumValueDescriptor *value_descriptor;
  undefined1 local_b0 [4];
  int i;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  string enum_options;
  string descriptor_name;
  EnumDescriptor *enum_descriptor_local;
  Generator *this_local;
  
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
            ((string *)((long)&enum_options.field_2 + 8),this,enum_descriptor);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"EnumOptions",&local_79);
  this_00 = EnumDescriptor::options(enum_descriptor);
  MessageLite::SerializeAsString_abi_cxx11_((string *)local_b0,(MessageLite *)this_00);
  OptionsValue((string *)local_58,this,&local_78,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"None");
  if (bVar1) {
    anon_unknown_0::PrintDescriptorOptionsFixingCode
              ((string *)((long)&enum_options.field_2 + 8),(string *)local_58,this->printer_);
  }
  for (value_descriptor._4_4_ = 0; iVar2 = EnumDescriptor::value_count(enum_descriptor),
      value_descriptor._4_4_ < iVar2; value_descriptor._4_4_ = value_descriptor._4_4_ + 1) {
    value_options.field_2._8_8_ = EnumDescriptor::value(enum_descriptor,value_descriptor._4_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"EnumValueOptions",&local_101);
    this_01 = EnumValueDescriptor::options((EnumValueDescriptor *)value_options.field_2._8_8_);
    MessageLite::SerializeAsString_abi_cxx11_(&local_128,(MessageLite *)this_01);
    OptionsValue((string *)local_e0,this,&local_100,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e0,"None");
    if (bVar1) {
      uVar3 = std::__cxx11::string::c_str();
      EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)value_options.field_2._8_8_);
      uVar4 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_(&local_148,"%s.values_by_name[\"%s\"]",uVar3,uVar4);
      anon_unknown_0::PrintDescriptorOptionsFixingCode(&local_148,(string *)local_e0,this->printer_)
      ;
      std::__cxx11::string::~string((string *)&local_148);
    }
    std::__cxx11::string::~string((string *)local_e0);
  }
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(enum_options.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Generator::FixOptionsForEnum(const EnumDescriptor& enum_descriptor) const {
  string descriptor_name = ModuleLevelDescriptorName(enum_descriptor);
  string enum_options = OptionsValue(
      "EnumOptions", enum_descriptor.options().SerializeAsString());
  if (enum_options != "None") {
    PrintDescriptorOptionsFixingCode(descriptor_name, enum_options, printer_);
  }
  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    const EnumValueDescriptor& value_descriptor = *enum_descriptor.value(i);
    string value_options = OptionsValue(
        "EnumValueOptions", value_descriptor.options().SerializeAsString());
    if (value_options != "None") {
      PrintDescriptorOptionsFixingCode(
          StringPrintf("%s.values_by_name[\"%s\"]", descriptor_name.c_str(),
                       value_descriptor.name().c_str()),
          value_options, printer_);
    }
  }
}